

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

CalloutListEntry * onig_reg_callout_list_at(regex_t *reg,int num)

{
  RegexExt *pRVar1;
  RegexExt *ext;
  int num_local;
  regex_t *reg_local;
  
  pRVar1 = reg->extp;
  if (pRVar1 == (RegexExt *)0x0) {
    reg_local = (regex_t *)0x0;
  }
  else if ((num < 1) || (pRVar1->callout_num < num)) {
    reg_local = (regex_t *)0x0;
  }
  else {
    reg_local = (regex_t *)(pRVar1->callout_list + (num + -1));
  }
  return (CalloutListEntry *)reg_local;
}

Assistant:

extern CalloutListEntry*
onig_reg_callout_list_at(regex_t* reg, int num)
{
  RegexExt* ext = reg->extp;
  CHECK_NULL_RETURN(ext);

  if (num <= 0 || num > ext->callout_num)
    return 0;

  num--;
  return ext->callout_list + num;
}